

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  CURLsslset CVar1;
  CURLsslset rc;
  curl_ssl_backend ***avail_local;
  char *name_local;
  curl_sslbackend id_local;
  
  curl_simple_lock_lock(&s_lock);
  CVar1 = Curl_init_sslset_nolock(id,name,avail);
  curl_simple_lock_unlock(&s_lock);
  return CVar1;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  CURLsslset rc;

  global_init_lock();

  rc = Curl_init_sslset_nolock(id, name, avail);

  global_init_unlock();

  return rc;
}